

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall GlobOpt::PrepareForIgnoringIntOverflow(GlobOpt *this,Instr *instr)

{
  SymKind SVar1;
  OpCode opcode;
  Type TVar2;
  IntOverflowDoesNotMatterRange *pIVar3;
  BasicBlock *pBVar4;
  undefined1 auVar5 [8];
  long lVar6;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  BOOLEAN BVar10;
  BOOLEAN BVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  undefined4 *puVar15;
  PropertySym *propertySym;
  Value *value;
  FloatConstantValueInfo *pFVar16;
  StackSym *pSVar17;
  Type_conflict pBVar18;
  JITTimeFunctionBody *pJVar19;
  FunctionJITTimeInfo *pFVar20;
  char16 *pcVar21;
  char16 *pcVar22;
  ulong uVar23;
  SymID id;
  Type_conflict pBVar24;
  ulong uVar25;
  ulong uVar26;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  wchar local_118 [4];
  char16 debugStringBuffer [42];
  Type_conflict local_b0;
  undefined1 auStack_98 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv2;
  undefined1 auStack_68 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv1;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x36d7,"(instr)","instr");
    if (!bVar8) goto LAB_0044ee20;
    *puVar15 = 0;
  }
  opcode = instr->m_opcode;
  if ((instr->field_0x37 & 1) != 0) {
    uVar12 = 0x100;
    if ((this->field_0xf4 & 2) != 0) {
      bVar8 = OpCodeAttr::IsInt32(opcode);
      uVar12 = (ushort)bVar8 << 8;
    }
    *(ushort *)&instr->field_0x36 = uVar12 | *(ushort *)&instr->field_0x36 & 0xfeff;
  }
  pIVar3 = this->intOverflowDoesNotMatterRange;
  if (pIVar3 == (IntOverflowDoesNotMatterRange *)0x0) {
    if ((this->field_0xf4 & 2) != 0) goto LAB_0044e8a2;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x36e4,"(intOverflowCurrentlyMattersInRange)",
                       "intOverflowCurrentlyMattersInRange");
    if (bVar8) {
      *puVar15 = 0;
      goto LAB_0044e8a2;
    }
    goto LAB_0044ee20;
  }
  if (pIVar3->lastInstr == instr) {
    if (opcode != NoIntOverflowBoundary) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x36ec,"(isBoundary)","isBoundary");
      if (!bVar8) goto LAB_0044ee20;
      *puVar15 = 0;
    }
    this->field_0xf4 = this->field_0xf4 | 2;
    this->intOverflowDoesNotMatterRange = this->intOverflowDoesNotMatterRange->next;
    goto LAB_0044e8a2;
  }
  if (((this->field_0xf4 & 2) == 0) || (pIVar3->firstInstr != instr)) goto LAB_0044e8a2;
  if (opcode != NoIntOverflowBoundary) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x36ff,"(isBoundary)","isBoundary");
    if (!bVar8) goto LAB_0044ee20;
    *puVar15 = 0;
  }
  this->field_0xf4 = this->field_0xf4 & 0xfd;
  tempBv2.lastFoundIndex = (Type_conflict)this->tempAlloc;
  tempBv1.alloc = (Type)auStack_68;
  auStack_68 = (undefined1  [8])0x0;
  tempBv1.head = (Type_conflict)0x0;
  tempBv2.alloc = (Type)auStack_98;
  auStack_98 = (undefined1  [8])0x0;
  tempBv2.head = (Type_conflict)0x0;
  local_b0 = (Type_conflict)&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt;
  tempBv1.lastFoundIndex = tempBv2.lastFoundIndex;
  tempBv1.lastUsedNodePrevNextField = (Type)__tls_get_addr(&PTR_0155fe48);
  uVar26 = 0;
  do {
    local_b0 = local_b0->next;
    if (local_b0 == (Type_conflict)0x0) break;
    uVar25 = (local_b0->data).word;
    if (uVar25 != 0) {
      TVar2 = local_b0->startIndex;
      uVar23 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
        }
      }
      do {
        BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar23);
        id = (BVIndex)uVar23 + TVar2;
        propertySym = (PropertySym *)SymTable::Find(this->func->m_symTable,id);
        if (propertySym == (PropertySym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3718,"(sym)","sym");
          if (!bVar8) goto LAB_0044ee20;
          *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 0;
        }
        SVar1 = (propertySym->super_Sym).m_kind;
        if (SVar1 == SymKindStack) {
          value = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,(Sym *)propertySym);
        }
        else {
          pBVar4 = this->currentBlock;
          if (SVar1 != SymKindProperty) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
            if (!bVar8) goto LAB_0044ee20;
            *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 0;
          }
          value = GlobOptBlockData::FindFuturePropertyValue(&pBVar4->globOptData,propertySym);
        }
        if (value == (Value *)0x0) {
LAB_0044e747:
          this->field_0xf4 = this->field_0xf4 | 2;
          bVar8 = true;
          local_b0 = (Type_conflict)0x0;
          uVar26 = (ulong)id;
        }
        else {
          bVar8 = ValueInfo::IsFloatConstant(value->valueInfo);
          if (bVar8) {
            pFVar16 = ValueInfo::AsFloatConstant(value->valueInfo);
            bVar8 = Js::JavascriptNumber::IsInt32OrUInt32(pFVar16->floatValue);
          }
          else {
            bVar8 = false;
          }
          bVar9 = ValueType::IsInt(&value->valueInfo->super_ValueType);
          if ((bVar8 | bVar9) == 1) {
            if (this->prePassLoop != (Loop *)0x0) goto LAB_0044e5e7;
            BVSparse<Memory::JitArenaAllocator>::Set
                      ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
                       (propertySym->super_Sym).m_id);
            bVar8 = false;
          }
          else {
            if (((this->field_0xf5 & 2) == 0) ||
               (bVar8 = ValueType::IsLikelyInt(&value->valueInfo->super_ValueType), !bVar8))
            goto LAB_0044e747;
            if (this->prePassLoop == (Loop *)0x0) {
              pSVar17 = GlobOptBlockData::GetCopyPropSym
                                  (&this->currentBlock->globOptData,(Sym *)propertySym,value);
              if (pSVar17 == (StackSym *)0x0) {
                if ((propertySym->super_Sym).m_kind != SymKindStack) goto LAB_0044e747;
              }
              else {
                BVSparse<Memory::JitArenaAllocator>::Set
                          ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
                           (propertySym->super_Sym).m_id);
                BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                                   ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
                                    (pSVar17->super_Sym).m_id);
                if (BVar10 != '\0') {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0x3753,"(!symsToExclude.Test(copyPropSym->m_id))",
                                     "!symsToExclude.Test(copyPropSym->m_id)");
                  if (!bVar8) goto LAB_0044ee20;
                  *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 0;
                }
                BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                                   (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                                    (propertySym->super_Sym).m_id);
                BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                                   (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                                    (pSVar17->super_Sym).m_id);
                if ((BVar11 == '\0') &&
                   (BVar11 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                                       ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,
                                        (pSVar17->super_Sym).m_id), BVar11 == '\0')) {
                  if (BVar10 != '\0') {
                    BVSparse<Memory::JitArenaAllocator>::Set
                              (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                               (pSVar17->super_Sym).m_id);
                  }
                }
                else if (BVar10 == '\0') {
                  BVSparse<Memory::JitArenaAllocator>::Clear
                            (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                             (pSVar17->super_Sym).m_id);
                }
              }
            }
LAB_0044e5e7:
            bVar8 = false;
          }
        }
        if (bVar8) break;
        uVar25 = uVar25 & ~(1L << (uVar23 & 0x3f));
        lVar6 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar23 = (ulong)(-(uint)(uVar25 == 0) | (uint)lVar6);
      } while (uVar25 != 0);
    }
  } while (local_b0 != (Type_conflict)0x0);
  if ((this->field_0xf4 & 2) == 0) {
    if (this->prePassLoop != (Loop *)0x0) goto LAB_0044ea31;
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_68);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_68);
    bVar8 = true;
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_98);
  }
  else {
    pJVar19 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar13 = JITTimeFunctionBody::GetSourceContextId(pJVar19);
    pFVar20 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar14 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar20);
    bVar8 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,TrackCompoundedIntOverflowPhase,uVar13,uVar14);
    if (bVar8 && this->prePassLoop == (Loop *)0x0) {
      pJVar19 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar21 = JITTimeFunctionBody::GetDisplayName(pJVar19);
      pFVar20 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar22 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar20,(wchar (*) [42])local_118);
      Output::Print(L"TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u, Disabled ignoring overflows\n"
                    ,pcVar21,pcVar22,L"Forward",(ulong)this->currentBlock->number);
      Output::Print(L"    Input sym could not be turned into an int:   %u\n",uVar26);
      Output::Print(L"    First instr: ");
      IR::Instr::Dump(instr->m_next);
      Output::Flush();
    }
    this->intOverflowDoesNotMatterRange = this->intOverflowDoesNotMatterRange->next;
LAB_0044ea31:
    bVar8 = false;
  }
  if (bVar8) {
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
               (this->currentBlock->globOptData).liveInt32Syms,
               (this->currentBlock->globOptData).liveLossyInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::And
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,
               &this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
               (this->currentBlock->globOptData).liveLossyInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_98);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_68);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_68);
    BVSparse<Memory::JitArenaAllocator>::Or
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
               (this->currentBlock->globOptData).liveInt32Syms,
               (this->currentBlock->globOptData).liveFloat64Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
               (this->currentBlock->globOptData).liveVarSyms);
    this_00 = (BVSparse<Memory::JitArenaAllocator> *)auStack_98;
    BVSparse<Memory::JitArenaAllocator>::Minus
              (this_00,&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_68);
    do {
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)this_00->head;
      if (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0044eb77;
    } while (((Type *)&this_00->alloc)->word == 0);
    if (this_00 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x37b1,"(deadSymsRequiredToBeInt.IsEmpty())",
                         "deadSymsRequiredToBeInt.IsEmpty()");
      if (!bVar9) {
LAB_0044ee20:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar15 = 0;
    }
LAB_0044eb77:
    if (auStack_98 != (undefined1  [8])0x0) {
      auVar5 = auStack_98;
      pBVar24 = *(Type_conflict *)&tempBv2.lastFoundIndex[5].startIndex;
      do {
        pBVar18 = (Type_conflict)auVar5;
        auVar5 = (undefined1  [8])pBVar18->next;
        pBVar18->next = pBVar24;
        pBVar24 = pBVar18;
      } while (auVar5 != (undefined1  [8])0x0);
      tempBv2.alloc = (Type)auStack_98;
      tempBv2.head = (Type_conflict)0x0;
      *(Type_conflict *)&tempBv2.lastFoundIndex[5].startIndex = pBVar18;
    }
    if (auStack_68 != (undefined1  [8])0x0) {
      auVar5 = auStack_68;
      pBVar24 = *(Type_conflict *)&tempBv1.lastFoundIndex[5].startIndex;
      do {
        pBVar18 = (Type_conflict)auVar5;
        auVar5 = (undefined1  [8])pBVar18->next;
        pBVar18->next = pBVar24;
        pBVar24 = pBVar18;
      } while (auVar5 != (undefined1  [8])0x0);
      tempBv1.head = (Type_conflict)0x0;
      *(Type_conflict *)&tempBv1.lastFoundIndex[5].startIndex = pBVar18;
      tempBv1.alloc = (Type)auStack_68;
    }
    if (bVar8) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                 &this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt);
      pJVar19 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar13 = JITTimeFunctionBody::GetSourceContextId(pJVar19);
      pFVar20 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar14 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar20);
      bVar8 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,TrackCompoundedIntOverflowPhase,uVar13,uVar14);
      if (bVar8) {
        pJVar19 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        pcVar21 = JITTimeFunctionBody::GetDisplayName(pJVar19);
        pFVar20 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        pcVar22 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar20,(wchar (*) [42])local_118);
        Output::Print(L"TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n",
                      pcVar21,pcVar22,L"Forward",(ulong)this->currentBlock->number);
        Output::Print(L"    Input syms to be int-specialized (lossless): ");
        BVSparse<Memory::JitArenaAllocator>::Dump
                  (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt);
        Output::Print(L"    Input syms to be converted to int (lossy):   ");
        BVSparse<Memory::JitArenaAllocator>::Dump
                  (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt);
        Output::Print(L"    First instr: ");
        IR::Instr::Dump(instr->m_next);
        Output::Flush();
      }
      ToTypeSpec(this,&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,this->currentBlock,
                 TyInt32,BailOutIntOnly,false,instr);
      ToTypeSpec(this,&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                 this->currentBlock,TyInt32,BailOutIntOnly,true,instr);
    }
  }
  else {
    if (auStack_98 != (undefined1  [8])0x0) {
      pBVar24 = *(Type_conflict *)&tempBv2.lastFoundIndex[5].startIndex;
      do {
        pBVar18 = (Type_conflict)auStack_98;
        auStack_98 = (undefined1  [8])pBVar18->next;
        pBVar18->next = pBVar24;
        pBVar24 = pBVar18;
      } while (auStack_98 != (undefined1  [8])0x0);
      *(Type_conflict *)&tempBv2.lastFoundIndex[5].startIndex = pBVar18;
    }
    if (auStack_68 != (undefined1  [8])0x0) {
      pBVar24 = *(Type_conflict *)&tempBv1.lastFoundIndex[5].startIndex;
      do {
        pBVar18 = (Type_conflict)auStack_68;
        auStack_68 = (undefined1  [8])pBVar18->next;
        pBVar18->next = pBVar24;
        pBVar24 = pBVar18;
      } while (auStack_68 != (undefined1  [8])0x0);
      *(Type_conflict *)&tempBv1.lastFoundIndex[5].startIndex = pBVar18;
    }
  }
LAB_0044e8a2:
  return opcode == NoIntOverflowBoundary;
}

Assistant:

bool
GlobOpt::PrepareForIgnoringIntOverflow(IR::Instr *const instr)
{
    Assert(instr);

    const bool isBoundary = instr->m_opcode == Js::OpCode::NoIntOverflowBoundary;

    // Update the instruction's "int overflow matters" flag based on whether we are currently allowing ignoring int overflows.
    // Some operations convert their srcs to int32s, those can still ignore int overflow.
    if(instr->ignoreIntOverflowInRange)
    {
        instr->ignoreIntOverflowInRange = !intOverflowCurrentlyMattersInRange || OpCodeAttr::IsInt32(instr->m_opcode);
    }

    if(!intOverflowDoesNotMatterRange)
    {
        Assert(intOverflowCurrentlyMattersInRange);

        // There are no more ranges of instructions where int overflow does not matter, in this block.
        return isBoundary;
    }

    if(instr == intOverflowDoesNotMatterRange->LastInstr())
    {
        Assert(isBoundary);

        // Reached the last instruction in the range
        intOverflowCurrentlyMattersInRange = true;
        intOverflowDoesNotMatterRange = intOverflowDoesNotMatterRange->Next();
        return isBoundary;
    }

    if(!intOverflowCurrentlyMattersInRange)
    {
        return isBoundary;
    }

    if(instr != intOverflowDoesNotMatterRange->FirstInstr())
    {
        // Have not reached the next range
        return isBoundary;
    }

    Assert(isBoundary);

    // This is the first instruction in a range of instructions where int overflow does not matter. There can be many inputs to
    // instructions in the range, some of which are inputs to the range itself (that is, the values are not defined in the
    // range). Ignoring int overflow is only valid for int operations, so we need to ensure that all inputs to the range are
    // int (not "likely int") before ignoring any overflows in the range. Ensuring that a sym with a "likely int" value is an
    // int requires a bail-out. These bail-out check need to happen before any overflows are ignored, otherwise it's too late.
    // The backward pass tracked all inputs into the range. Iterate over them and verify the values, and insert lossless
    // conversions to int as necessary, before the first instruction in the range. If for any reason all values cannot be
    // guaranteed to be ints, the optimization will be disabled for this range.
    intOverflowCurrentlyMattersInRange = false;
    {
        BVSparse<JitArenaAllocator> tempBv1(tempAlloc);
        BVSparse<JitArenaAllocator> tempBv2(tempAlloc);

        {
            // Just renaming the temp BVs for this section to indicate how they're used so that it makes sense
            BVSparse<JitArenaAllocator> &symsToExclude = tempBv1;
            BVSparse<JitArenaAllocator> &symsToInclude = tempBv2;
#if DBG_DUMP
            SymID couldNotConvertSymId = 0;
#endif
            FOREACH_BITSET_IN_SPARSEBV(id, intOverflowDoesNotMatterRange->SymsRequiredToBeInt())
            {
                Sym *const sym = func->m_symTable->Find(id);
                Assert(sym);

                // Some instructions with property syms are also tracked by the backward pass, and may be included in the range
                // (LdSlot for instance). These property syms don't get their values until either copy-prop resolves a value for
                // them, or a new value is created once the use of the property sym is reached. In either case, we're not that
                // far yet, so we need to find the future value of the property sym by evaluating copy-prop in reverse.
                Value *const value = sym->IsStackSym() ? CurrentBlockData()->FindValue(sym) : CurrentBlockData()->FindFuturePropertyValue(sym->AsPropertySym());
                if(!value)
                {
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }

                const bool isInt32OrUInt32Float =
                    value->GetValueInfo()->IsFloatConstant() &&
                    Js::JavascriptNumber::IsInt32OrUInt32(value->GetValueInfo()->AsFloatConstant()->FloatValue());
                if(value->GetValueInfo()->IsInt() || isInt32OrUInt32Float)
                {
                    if(!IsLoopPrePass())
                    {
                        // Input values that are already int can be excluded from int-specialization. We can treat unsigned
                        // int32 values as int32 values (ignoring the overflow), since the values will only be used inside the
                        // range where overflow does not matter.
                        symsToExclude.Set(sym->m_id);
                    }
                    continue;
                }

                if(!DoAggressiveIntTypeSpec() || !value->GetValueInfo()->IsLikelyInt())
                {
                    // When aggressive int specialization is off, syms with "likely int" values cannot be forced to int since
                    // int bail-out checks are not allowed in that mode. Similarly, with aggressive int specialization on, it
                    // wouldn't make sense to force non-"likely int" values to int since it would almost guarantee a bail-out at
                    // runtime. In both cases, just disable ignoring overflow for this range.
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }

                if(IsLoopPrePass())
                {
                    // The loop prepass does not modify bit-vectors. Since it doesn't add bail-out checks, it also does not need
                    // to specialize anything up-front. It only needs to be consistent in how it determines whether to allow
                    // ignoring overflow for a range, based on the values of inputs into the range.
                    continue;
                }

                // Since input syms are tracked in the backward pass, where there is no value tracking, it will not be aware of
                // copy-prop. If a copy-prop sym is available, it will be used instead, so exclude the original sym and include
                // the copy-prop sym for specialization.
                StackSym *const copyPropSym = CurrentBlockData()->GetCopyPropSym(sym, value);
                if(copyPropSym)
                {
                    symsToExclude.Set(sym->m_id);
                    Assert(!symsToExclude.Test(copyPropSym->m_id));

                    const bool needsToBeLossless =
                        !intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Test(sym->m_id);
                    if(intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Test(copyPropSym->m_id) ||
                        symsToInclude.TestAndSet(copyPropSym->m_id))
                    {
                        // The copy-prop sym is already included
                        if(needsToBeLossless)
                        {
                            // The original sym needs to be lossless, so make the copy-prop sym lossless as well.
                            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Clear(copyPropSym->m_id);
                        }
                    }
                    else if(!needsToBeLossless)
                    {
                        // The copy-prop sym was not included before, and the original sym can be lossy, so make it lossy.
                        intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Set(copyPropSym->m_id);
                    }
                }
                else if(!sym->IsStackSym())
                {
                    // Only stack syms can be converted to int, and copy-prop syms are stack syms. If a copy-prop sym was not
                    // found for the property sym, we can't ignore overflows in this range.
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }
            } NEXT_BITSET_IN_SPARSEBV;

            if(intOverflowCurrentlyMattersInRange)
            {
#if DBG_DUMP
                if(PHASE_TRACE(Js::TrackCompoundedIntOverflowPhase, func) && !IsLoopPrePass())
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(
                        _u("TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u, Disabled ignoring overflows\n"),
                        func->GetJITFunctionBody()->GetDisplayName(),
                        func->GetDebugNumberSet(debugStringBuffer),
                        Js::PhaseNames[Js::ForwardPhase],
                        currentBlock->GetBlockNum());
                    Output::Print(_u("    Input sym could not be turned into an int:   %u\n"), couldNotConvertSymId);
                    Output::Print(_u("    First instr: "));
                    instr->m_next->Dump();
                    Output::Flush();
                }
#endif
                intOverflowDoesNotMatterRange = intOverflowDoesNotMatterRange->Next();
                return isBoundary;
            }

            if(IsLoopPrePass())
            {
                return isBoundary;
            }

            // Update the syms to specialize after enumeration
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Or(&symsToInclude);
        }

        {
            // Exclude syms that are already live as lossless int32, and exclude lossy conversions of syms that are already live
            // as lossy int32.
            //     symsToExclude = liveInt32Syms - liveLossyInt32Syms                   // syms live as lossless int
            //     lossySymsToExclude = symsRequiredToBeLossyInt & liveLossyInt32Syms;  // syms we want as lossy int that are already live as lossy int
            //     symsToExclude |= lossySymsToExclude
            //     symsRequiredToBeInt -= symsToExclude
            //     symsRequiredToBeLossyInt -= symsToExclude
            BVSparse<JitArenaAllocator> &symsToExclude = tempBv1;
            BVSparse<JitArenaAllocator> &lossySymsToExclude = tempBv2;
            symsToExclude.Minus(CurrentBlockData()->liveInt32Syms, CurrentBlockData()->liveLossyInt32Syms);
            lossySymsToExclude.And(
                intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt(),
                CurrentBlockData()->liveLossyInt32Syms);
            symsToExclude.Or(&lossySymsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Minus(&symsToExclude);
        }

#if DBG
        {
            // Verify that the syms to be converted are live
            //     liveSyms = liveInt32Syms | liveFloat64Syms | liveVarSyms
            //     deadSymsRequiredToBeInt = symsRequiredToBeInt - liveSyms
            BVSparse<JitArenaAllocator> &liveSyms = tempBv1;
            BVSparse<JitArenaAllocator> &deadSymsRequiredToBeInt = tempBv2;
            liveSyms.Or(CurrentBlockData()->liveInt32Syms, CurrentBlockData()->liveFloat64Syms);
            liveSyms.Or(CurrentBlockData()->liveVarSyms);
            deadSymsRequiredToBeInt.Minus(intOverflowDoesNotMatterRange->SymsRequiredToBeInt(), &liveSyms);
            Assert(deadSymsRequiredToBeInt.IsEmpty());
        }
#endif
    }

    // Int-specialize the syms before the first instruction of the range (the current instruction)
    intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt());

#if DBG_DUMP
    if(PHASE_TRACE(Js::TrackCompoundedIntOverflowPhase, func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(
            _u("TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n"),
            func->GetJITFunctionBody()->GetDisplayName(),
            func->GetDebugNumberSet(debugStringBuffer),
            Js::PhaseNames[Js::ForwardPhase],
            currentBlock->GetBlockNum());
        Output::Print(_u("    Input syms to be int-specialized (lossless): "));
        intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Dump();
        Output::Print(_u("    Input syms to be converted to int (lossy):   "));
        intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Dump();
        Output::Print(_u("    First instr: "));
        instr->m_next->Dump();
        Output::Flush();
    }
#endif

    ToInt32(intOverflowDoesNotMatterRange->SymsRequiredToBeInt(), currentBlock, false /* lossy */, instr);
    ToInt32(intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt(), currentBlock, true /* lossy */, instr);
    return isBoundary;
}